

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardShapes.cpp
# Opt level: O0

void Assimp::StandardShapes::MakeCone
               (ai_real height,ai_real radius1,ai_real radius2,uint tess,
               vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions,bool bOpen)

{
  int iVar1;
  size_type sVar2;
  ulong uVar3;
  reference __a;
  reference __b;
  ai_real aVar4;
  float fVar5;
  double dVar6;
  int local_e0;
  size_type local_d8;
  size_t p;
  aiVector3t<float> local_c4;
  aiVector3t<float> local_b8;
  aiVector3t<float> local_ac;
  aiVector3t<float> local_a0;
  aiVector3t<float> local_94;
  undefined1 local_88 [8];
  aiVector3D v4;
  aiVector3D v3;
  ai_real t2;
  ai_real s2;
  ai_real next;
  aiVector3D v2;
  aiVector3D v1;
  ai_real angle;
  ai_real t;
  ai_real s;
  ai_real angle_max;
  ai_real angle_delta;
  uint mem;
  ai_real halfHeight;
  size_t old;
  bool bOpen_local;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions_local;
  uint tess_local;
  ai_real radius2_local;
  ai_real radius1_local;
  ai_real height_local;
  
  if ((2 < tess) && ((height != 0.0 || (NAN(height))))) {
    positions_local._0_4_ = tess;
    positions_local._4_4_ = radius2;
    tess_local = (uint)radius1;
    radius2_local = height;
    _mem = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(positions);
    dVar6 = std::fabs((double)(ulong)tess_local);
    tess_local = SUB84(dVar6,0);
    dVar6 = std::fabs((double)(ulong)(uint)positions_local._4_4_);
    positions_local._4_4_ = SUB84(dVar6,0);
    angle_delta = radius2_local / 2.0;
    if (positions_local._4_4_ <= (float)tess_local) {
      _mem = 0xffffffffffffffff;
    }
    else {
      std::swap<float>((float *)((long)&positions_local + 4),(float *)&tess_local);
      angle_delta = -angle_delta;
    }
    if ((float)tess_local < (positions_local._4_4_ - (float)tess_local) * 0.01) {
      tess_local = 0;
    }
    iVar1 = (uint)positions_local * 6;
    if (bOpen) {
      local_e0 = 0;
    }
    else {
      local_e0 = 1;
      if ((float)tess_local != 0.0) {
        local_e0 = 2;
      }
      local_e0 = (uint)positions_local * 3 * local_e0;
    }
    sVar2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(positions);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (positions,sVar2 + (uint)(iVar1 + local_e0));
    uVar3 = (ulong)(uint)positions_local;
    angle = 1.0;
    v1.z = 0.0;
    v1.y = 0.0;
    fVar5 = v1.z;
    aVar4 = angle;
    while (angle = aVar4, v1.z = fVar5, v1.y < 6.2831855) {
      aiVector3t<float>::aiVector3t
                ((aiVector3t<float> *)&v2.y,angle * (float)tess_local,-angle_delta,
                 v1.z * (float)tess_local);
      aiVector3t<float>::aiVector3t
                ((aiVector3t<float> *)&s2,angle * positions_local._4_4_,angle_delta,
                 v1.z * positions_local._4_4_);
      v1.y = v1.y + 6.2831855 / (float)uVar3;
      dVar6 = std::cos((double)(ulong)(uint)v1.y);
      aVar4 = SUB84(dVar6,0);
      dVar6 = std::sin((double)(ulong)(uint)v1.y);
      fVar5 = SUB84(dVar6,0);
      aiVector3t<float>::aiVector3t
                ((aiVector3t<float> *)&v4.y,aVar4 * positions_local._4_4_,angle_delta,
                 fVar5 * positions_local._4_4_);
      aiVector3t<float>::aiVector3t
                ((aiVector3t<float> *)local_88,aVar4 * (float)tess_local,-angle_delta,
                 fVar5 * (float)tess_local);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (positions,(value_type *)&v2.y);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (positions,(value_type *)&s2);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (positions,(value_type *)&v4.y);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (positions,(value_type *)local_88);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (positions,(value_type *)&v2.y);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (positions,(value_type *)&v4.y);
      if (!bOpen) {
        aiVector3t<float>::aiVector3t
                  (&local_94,angle * positions_local._4_4_,angle_delta,v1.z * positions_local._4_4_)
        ;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (positions,&local_94);
        aiVector3t<float>::aiVector3t
                  (&local_a0,aVar4 * positions_local._4_4_,angle_delta,fVar5 * positions_local._4_4_
                  );
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (positions,&local_a0);
        aiVector3t<float>::aiVector3t(&local_ac,0.0,angle_delta,0.0);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (positions,&local_ac);
        if (((float)tess_local != 0.0) || (NAN((float)tess_local))) {
          aiVector3t<float>::aiVector3t
                    (&local_b8,angle * (float)tess_local,-angle_delta,v1.z * (float)tess_local);
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                    (positions,&local_b8);
          aiVector3t<float>::aiVector3t
                    (&local_c4,aVar4 * (float)tess_local,-angle_delta,fVar5 * (float)tess_local);
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                    (positions,&local_c4);
          aiVector3t<float>::aiVector3t((aiVector3t<float> *)&p,0.0,-angle_delta,0.0);
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                    (positions,(value_type *)&p);
        }
      }
    }
    if (_mem != 0xffffffffffffffff) {
      for (local_d8 = _mem;
          sVar2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                            (positions), local_d8 < sVar2; local_d8 = local_d8 + 3) {
        __a = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                        (positions,local_d8);
        __b = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                        (positions,local_d8 + 1);
        std::swap<aiVector3t<float>>(__a,__b);
      }
    }
  }
  return;
}

Assistant:

void StandardShapes::MakeCone(ai_real height,ai_real radius1,
    ai_real radius2,unsigned int tess,
    std::vector<aiVector3D>& positions,bool bOpen /*= false */)
{
    // Sorry, a cone with less than 3 segments makes ABSOLUTELY NO SENSE
    if (tess < 3 || !height)
        return;

    size_t old = positions.size();

    // No negative radii
    radius1 = std::fabs(radius1);
    radius2 = std::fabs(radius2);

    ai_real halfHeight = height / ai_real(2.0);

    // radius1 is always the smaller one
    if (radius2 > radius1)
    {
        std::swap(radius2,radius1);
        halfHeight = -halfHeight;
    }
    else old = SIZE_MAX;

    // Use a large epsilon to check whether the cone is pointy
    if (radius1 < (radius2-radius1)*10e-3)radius1 = 0.0;

    // We will need 3*2 verts per segment + 3*2 verts per segment
    // if the cone is closed
    const unsigned int mem = tess*6 + (!bOpen ? tess*3 * (radius1 ? 2 : 1) : 0);
    positions.reserve(positions.size () + mem);

    // Now construct all segments
    const ai_real angle_delta = (ai_real)AI_MATH_TWO_PI / tess;
    const ai_real angle_max   = (ai_real)AI_MATH_TWO_PI;

    ai_real s = 1.0; // std::cos(angle == 0);
    ai_real t = 0.0; // std::sin(angle == 0);

    for (ai_real angle = 0.0; angle < angle_max; )
    {
        const aiVector3D v1 = aiVector3D (s * radius1, -halfHeight, t * radius1 );
        const aiVector3D v2 = aiVector3D (s * radius2,  halfHeight, t * radius2 );

        const ai_real next = angle + angle_delta;
        ai_real s2 = std::cos(next);
        ai_real t2 = std::sin(next);

        const aiVector3D v3 = aiVector3D (s2 * radius2,  halfHeight, t2 * radius2 );
        const aiVector3D v4 = aiVector3D (s2 * radius1, -halfHeight, t2 * radius1 );

        positions.push_back(v1);
        positions.push_back(v2);
        positions.push_back(v3);
        positions.push_back(v4);
        positions.push_back(v1);
        positions.push_back(v3);

        if (!bOpen)
        {
            // generate the end 'cap'
            positions.push_back(aiVector3D(s * radius2,  halfHeight, t * radius2 ));
            positions.push_back(aiVector3D(s2 * radius2,  halfHeight, t2 * radius2 ));
            positions.push_back(aiVector3D(0.0, halfHeight, 0.0));


            if (radius1)
            {
                // generate the other end 'cap'
                positions.push_back(aiVector3D(s * radius1,  -halfHeight, t * radius1 ));
                positions.push_back(aiVector3D(s2 * radius1,  -halfHeight, t2 * radius1 ));
                positions.push_back(aiVector3D(0.0, -halfHeight, 0.0));

            }
        }
        s = s2;
        t = t2;
        angle = next;
    }

    // Need to flip face order?
    if ( SIZE_MAX != old )  {
        for (size_t p = old; p < positions.size();p += 3) {
            std::swap(positions[p],positions[p+1]);
        }
    }
}